

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

char16_t * __thiscall
QUtf8::convertToUnicode(QUtf8 *this,char16_t *dst,QByteArrayView in,State *state)

{
  undefined1 auVar1 [16];
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  bool bVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  uint uVar25;
  long lVar26;
  long lVar27;
  uint *puVar28;
  char16_t cVar29;
  byte *pbVar30;
  byte *pbVar31;
  byte *pbVar32;
  byte *pbVar33;
  long lVar34;
  uint c;
  byte *in_R11;
  char16_t *__n;
  uchar *end;
  byte *pbVar35;
  size_t __n_00;
  QUtf8 *pQVar36;
  long in_FS_OFFSET;
  char cVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  QUtf8 *local_60;
  byte local_3c [4];
  long local_38;
  
  puVar28 = (uint *)in.m_data;
  pbVar35 = (byte *)in.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (dst == (char16_t *)0x0) goto LAB_001251ff;
  uVar3 = *puVar28;
  cVar29 = L'�';
  if ((uVar3 & 2) != 0) {
    cVar29 = L'\0';
  }
  pbVar30 = pbVar35;
  pQVar36 = this;
  if ((uVar3 & 1) == 0) {
    uVar4 = puVar28[1];
    uVar25 = uVar4 & 1;
    lVar27 = *(long *)(puVar28 + 2);
    if (lVar27 == 0 && ((uVar3 & 8) != 0 || uVar25 != 0)) {
      bVar18 = true;
    }
    else {
      __n = (char16_t *)(4 - lVar27);
      if ((long)dst <= 4 - lVar27) {
        __n = dst;
      }
      local_3c[0] = 0;
      local_3c[1] = 0;
      local_3c[2] = 0;
      local_3c[3] = 0;
      __memcpy_chk(local_3c,puVar28 + 6,lVar27,4);
      memcpy(local_3c + lVar27,pbVar35,(size_t)__n);
      if ((char)local_3c[0] < '\0') {
        if (0xc1 < local_3c[0]) {
          if (local_3c[0] < 0xe0) {
            lVar26 = 2;
          }
          else if (local_3c[0] < 0xf0) {
            lVar26 = 3;
          }
          else {
            if (0xf4 < local_3c[0]) {
              lVar26 = -1;
              goto LAB_00124e00;
            }
            lVar26 = 4;
          }
          lVar34 = (long)(local_3c + lVar27 + (long)__n) - (long)(local_3c + 1);
          if (((lVar34 < lVar26 + -1) && (lVar34 < 1)) && (lVar34 < 2)) {
            lVar26 = -2;
            goto LAB_00124e00;
          }
        }
        lVar26 = -1;
      }
      else {
        *(ushort *)this = (ushort)local_3c[0];
        this = this + 2;
        lVar26 = 1;
      }
LAB_00124e00:
      pQVar36 = this;
      local_60 = (QUtf8 *)dst;
      if (lVar26 == -2) {
        *(long *)(puVar28 + 2) = (long)__n + lVar27;
        memcpy(puVar28 + 6,local_3c,(long)__n + lVar27);
        bVar18 = false;
      }
      else {
        if (lVar26 == -1) {
          *(long *)(puVar28 + 4) = *(long *)(puVar28 + 4) + 1;
          *(char16_t *)this = cVar29;
          pbVar30 = pbVar35 + 1;
          pQVar36 = this + 2;
        }
        else if (((uVar3 & 8) == 0 && uVar25 == 0) &&
                (pQVar36 = this + -2, *(char16_t *)(this + -2) != L'\xfeff')) {
          pQVar36 = this;
        }
        puVar28[1] = uVar4 | 1;
        bVar18 = true;
        if (-1 < lVar26) {
          pbVar30 = pbVar30 + (lVar26 - lVar27);
        }
      }
    }
    if (!bVar18) goto LAB_001251ff;
  }
  else if (((2 < (long)dst && (char)((uVar3 & 8) >> 3) == '\0') && (*pbVar35 == 0xef)) &&
          (pbVar35[1] == 0xbb)) {
    pbVar30 = pbVar35 + (ulong)(pbVar35[2] == 0xbf) * 3;
  }
  pbVar35 = pbVar35 + (long)dst;
  if (pbVar35 != pbVar30 && -1 < (long)pbVar35 - (long)pbVar30) {
    lVar27 = 0;
    pbVar32 = pbVar30;
    do {
      pbVar31 = pbVar35;
      if (0xf < (long)pbVar35 - (long)pbVar32) {
        lVar34 = 0;
        lVar26 = 0;
LAB_00124ee2:
        if (lVar26 + 0x10 < (long)pbVar35 - (long)pbVar32) goto code_r0x00124ef1;
        pQVar36 = pQVar36 + ((long)pbVar35 - (long)pbVar32) * 2;
        auVar1 = *(undefined1 (*) [16])(pbVar35 + -0x10);
        uVar5 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
        auVar7[0xd] = 0;
        auVar7._0_13_ = auVar1._0_13_;
        auVar7[0xe] = auVar1[7];
        auVar9[0xc] = auVar1[6];
        auVar9._0_12_ = auVar1._0_12_;
        auVar9._13_2_ = auVar7._13_2_;
        auVar11[0xb] = 0;
        auVar11._0_11_ = auVar1._0_11_;
        auVar11._12_3_ = auVar9._12_3_;
        auVar13[10] = auVar1[5];
        auVar13._0_10_ = auVar1._0_10_;
        auVar13._11_4_ = auVar11._11_4_;
        auVar15[9] = 0;
        auVar15._0_9_ = auVar1._0_9_;
        auVar15._10_5_ = auVar13._10_5_;
        auVar17[8] = auVar1[4];
        auVar17._0_8_ = auVar1._0_8_;
        auVar17._9_6_ = auVar15._9_6_;
        auVar20._7_8_ = 0;
        auVar20._0_7_ = auVar17._8_7_;
        auVar23._1_8_ = SUB158(auVar20 << 0x40,7);
        auVar23[0] = auVar1[3];
        auVar23._9_6_ = 0;
        auVar24._1_10_ = SUB1510(auVar23 << 0x30,5);
        auVar24[0] = auVar1[2];
        auVar24._11_4_ = 0;
        auVar41._3_12_ = SUB1512(auVar24 << 0x20,3);
        auVar41[2] = auVar1[1];
        auVar41[0] = auVar1[0];
        auVar41[1] = 0;
        auVar41[0xf] = 0;
        *(undefined1 (*) [16])(pQVar36 + -0x20) = auVar41;
        auVar39[1] = 0;
        auVar39[0] = auVar1[8];
        auVar39[2] = auVar1[9];
        auVar39[3] = 0;
        auVar39[4] = auVar1[10];
        auVar39[5] = 0;
        auVar39[6] = auVar1[0xb];
        auVar39[7] = 0;
        auVar39[8] = auVar1[0xc];
        auVar39[9] = 0;
        auVar39[10] = auVar1[0xd];
        auVar39[0xb] = 0;
        auVar39[0xc] = auVar1[0xe];
        auVar39[0xd] = 0;
        auVar39[0xe] = auVar1[0xf];
        auVar39[0xf] = 0;
        *(undefined1 (*) [16])(pQVar36 + -0x10) = auVar39;
        uVar3 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        pbVar32 = pbVar35;
        if (uVar5 != 0) {
          pbVar31 = pbVar35 + ((ulong)uVar4 - 0xf);
          pQVar36 = pQVar36 + (ulong)uVar3 * 2 + -0x20;
          pbVar32 = pbVar35 + ((ulong)uVar3 - 0x10);
        }
        in_R11 = (byte *)(ulong)(pbVar32 == pbVar35);
        goto LAB_00124fb1;
      }
      in_R11 = (byte *)(ulong)(pbVar32 == pbVar35);
LAB_00124fb1:
      pbVar33 = pbVar32;
      this = pQVar36;
      if (((ulong)in_R11 & 1) != 0) goto LAB_001251a9;
      do {
        pbVar32 = pbVar33 + 1;
        bVar2 = *pbVar33;
        if ((char)bVar2 < '\0') {
          if (0xc1 < bVar2) {
            if (bVar2 < 0xe0) {
              lVar26 = 2;
            }
            else if (bVar2 < 0xf0) {
              lVar26 = 3;
            }
            else {
              if (0xf4 < bVar2) goto LAB_00125136;
              lVar26 = 4;
            }
            lVar34 = (long)pbVar35 - (long)pbVar32;
            if (((lVar34 < lVar26 + -1) && (lVar34 < 1)) && (lVar34 < 2)) {
              lVar26 = -2;
              goto LAB_00125140;
            }
          }
LAB_00125136:
          lVar26 = -1;
        }
        else {
          *(ushort *)pQVar36 = (ushort)bVar2;
          pQVar36 = pQVar36 + 2;
          lVar26 = 1;
        }
LAB_00125140:
        cVar37 = '\x05';
        if (lVar26 < 0) {
          lVar27 = lVar26;
          if (lVar26 == -1) {
            *(long *)(puVar28 + 4) = *(long *)(puVar28 + 4) + 1;
            *(char16_t *)pQVar36 = cVar29;
            pQVar36 = pQVar36 + 2;
            lVar27 = 0;
          }
          cVar37 = lVar27 != 0;
          pbVar30 = pbVar32;
          if ((bool)cVar37) {
            local_60 = pQVar36;
          }
        }
        if ((cVar37 != '\x05') && (this = local_60, cVar37 != '\0')) goto LAB_001251a9;
        pbVar33 = pbVar32;
      } while (pbVar32 < pbVar31);
      in_R11 = pbVar32;
      this = pQVar36;
      if (pbVar35 <= pbVar32) goto LAB_001251a9;
    } while( true );
  }
  lVar27 = 0;
  this = pQVar36;
LAB_001251a9:
  if (lVar27 == -2) {
    if ((*puVar28 & 1) == 0) {
      __n_00 = (long)pbVar35 - (long)(pbVar30 + -1);
      *(size_t *)(puVar28 + 2) = __n_00;
      memcpy(puVar28 + 6,pbVar30 + -1,__n_00);
      goto LAB_001251ff;
    }
    *(char16_t *)this = L'�';
    lVar27 = *(long *)(puVar28 + 4);
    while( true ) {
      this = this + 2;
      lVar27 = lVar27 + 1;
      if (pbVar35 <= pbVar30) break;
      pbVar30 = pbVar30 + 1;
      *(char16_t *)this = L'�';
    }
    *(long *)(puVar28 + 4) = lVar27;
  }
  puVar28[2] = 0;
  puVar28[3] = 0;
LAB_001251ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (char16_t *)this;
  }
  __stack_chk_fail();
code_r0x00124ef1:
  auVar1 = *(undefined1 (*) [16])(pbVar32 + lVar26);
  uVar5 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar1._0_13_;
  auVar6[0xe] = auVar1[7];
  auVar8[0xc] = auVar1[6];
  auVar8._0_12_ = auVar1._0_12_;
  auVar8._13_2_ = auVar6._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar1._0_11_;
  auVar10._12_3_ = auVar8._12_3_;
  auVar12[10] = auVar1[5];
  auVar12._0_10_ = auVar1._0_10_;
  auVar12._11_4_ = auVar10._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar1._0_9_;
  auVar14._10_5_ = auVar12._10_5_;
  auVar16[8] = auVar1[4];
  auVar16._0_8_ = auVar1._0_8_;
  auVar16._9_6_ = auVar14._9_6_;
  auVar19._7_8_ = 0;
  auVar19._0_7_ = auVar16._8_7_;
  auVar21._1_8_ = SUB158(auVar19 << 0x40,7);
  auVar21[0] = auVar1[3];
  auVar21._9_6_ = 0;
  auVar22._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar22[0] = auVar1[2];
  auVar22._11_4_ = 0;
  auVar40._3_12_ = SUB1512(auVar22 << 0x20,3);
  auVar40[2] = auVar1[1];
  auVar40[0] = auVar1[0];
  auVar40[1] = 0;
  auVar40[0xf] = 0;
  *(undefined1 (*) [16])(pQVar36 + lVar34) = auVar40;
  auVar38[1] = 0;
  auVar38[0] = auVar1[8];
  auVar38[2] = auVar1[9];
  auVar38[3] = 0;
  auVar38[4] = auVar1[10];
  auVar38[5] = 0;
  auVar38[6] = auVar1[0xb];
  auVar38[7] = 0;
  auVar38[8] = auVar1[0xc];
  auVar38[9] = 0;
  auVar38[10] = auVar1[0xd];
  auVar38[0xb] = 0;
  auVar38[0xc] = auVar1[0xe];
  auVar38[0xd] = 0;
  auVar38[0xe] = auVar1[0xf];
  auVar38[0xf] = 0;
  *(undefined1 (*) [16])(pQVar36 + lVar34 + 0x10) = auVar38;
  if (uVar5 != 0) {
    uVar3 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    uVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    pbVar31 = pbVar32 + lVar26 + (ulong)uVar4 + 1;
    pbVar32 = pbVar32 + (ulong)uVar3 + lVar26;
    pQVar36 = pQVar36 + lVar34 + (ulong)uVar3 * 2;
    in_R11 = (byte *)(ulong)(pbVar32 == pbVar35);
  }
  lVar34 = lVar34 + 0x20;
  lVar26 = lVar26 + 0x10;
  if (uVar5 != 0) goto LAB_00124fb1;
  goto LAB_00124ee2;
}

Assistant:

char16_t *QUtf8::convertToUnicode(char16_t *dst, QByteArrayView in, QStringConverter::State *state)
{
    qsizetype len = in.size();

    Q_ASSERT(state);
    if (!len)
        return dst;


    char16_t replacement = QChar::ReplacementCharacter;
    if (state->flags & QStringConverter::Flag::ConvertInvalidToNull)
        replacement = QChar::Null;

    qsizetype res;

    const uchar *src = reinterpret_cast<const uchar *>(in.data());
    const uchar *end = src + len;

    if (!(state->flags & QStringConverter::Flag::Stateless)) {
        bool headerdone = state->internalState & HeaderDone || state->flags & QStringConverter::Flag::ConvertInitialBom;
        if (state->remainingChars || !headerdone) {
            // handle incoming state first
            uchar remainingCharsData[4]; // longest UTF-8 sequence possible
            qsizetype remainingCharsCount = state->remainingChars;
            qsizetype newCharsToCopy = qMin<qsizetype>(sizeof(remainingCharsData) - remainingCharsCount, end - src);

            memset(remainingCharsData, 0, sizeof(remainingCharsData));
            memcpy(remainingCharsData, &state->state_data[0], remainingCharsCount);
            memcpy(remainingCharsData + remainingCharsCount, src, newCharsToCopy);

            const uchar *begin = &remainingCharsData[1];
            res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(remainingCharsData[0], dst, begin,
                    static_cast<const uchar *>(remainingCharsData) + remainingCharsCount + newCharsToCopy);
            if (res == QUtf8BaseTraits::Error) {
                ++state->invalidChars;
                *dst++ = replacement;
                ++src;
            } else if (res == QUtf8BaseTraits::EndOfString) {
                // if we got EndOfString again, then there were too few bytes in src;
                // copy to our state and return
                state->remainingChars = remainingCharsCount + newCharsToCopy;
                memcpy(&state->state_data[0], remainingCharsData, state->remainingChars);
                return dst;
            } else if (!headerdone) {
                // eat the UTF-8 BOM
                if (dst[-1] == 0xfeff)
                    --dst;
            }
            state->internalState |= HeaderDone;

            // adjust src now that we have maybe consumed a few chars
            if (res >= 0) {
                Q_ASSERT(res > remainingCharsCount);
                src += res - remainingCharsCount;
            }
        }
    } else if (!(state->flags & QStringConverter::Flag::ConvertInitialBom)) {
        // stateless, remove initial BOM
        if (len > 2 && src[0] == utf8bom[0] && src[1] == utf8bom[1] && src[2] == utf8bom[2])
            // skip BOM
            src += 3;
    }

    // main body, stateless decoding
    res = 0;
    dst = convertToUnicode(dst, { src, end }, [&](char16_t *&dst, const uchar *src_, int res_) {
        res = res_;
        src = src_;
        if (res == QUtf8BaseTraits::Error) {
            res = 0;
            ++state->invalidChars;
            *dst++ = replacement;
        }
        return res == 0;    // continue if plain decoding error
    });

    if (res == QUtf8BaseTraits::EndOfString) {
        // unterminated UTF sequence
        if (state->flags & QStringConverter::Flag::Stateless) {
            *dst++ = QChar::ReplacementCharacter;
            ++state->invalidChars;
            while (src++ < end) {
                *dst++ = QChar::ReplacementCharacter;
                ++state->invalidChars;
            }
            state->remainingChars = 0;
        } else {
            --src; // unread the byte in ch
            state->remainingChars = end - src;
            memcpy(&state->state_data[0], src, end - src);
        }
    } else {
        state->remainingChars = 0;
    }

    return dst;
}